

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

void igPushClipRect(ImVec2 clip_rect_min,ImVec2 clip_rect_max,bool intersect_with_current_clip_rect)

{
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10 = clip_rect_max;
  local_8 = clip_rect_min;
  ImGui::PushClipRect(&local_8,&local_10,intersect_with_current_clip_rect);
  return;
}

Assistant:

CIMGUI_API void _igPushClipRect (ImVec2 const *larg1, ImVec2 const *larg2, int larg3) {
  ImVec2 arg1 ;
  ImVec2 arg2 ;
  bool arg3 ;
  
  arg1 = *larg1;
  arg2 = *larg2;
  arg3 = (bool)larg3;
  try {
    igPushClipRect(arg1,arg2,arg3);
    
  } catch (...) {
    
  }
}